

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase813::run(TestCase813 *this)

{
  long *plVar1;
  ArrayPtr<const_kj::OwnFd> fds;
  AsyncInputStream node;
  undefined1 node_00 [8];
  int iVar2;
  __pid_t _Var3;
  undefined4 extraout_var;
  size_t sVar4;
  _func_int **extraout_RDX;
  long lVar5;
  OwnFd *this_00;
  ArrayPtr<const_unsigned_char> data;
  Fault f;
  ssize_t n;
  OwnFd sendFds [3];
  OwnFd in2;
  OwnFd in1;
  char buffer [4];
  OwnFd in3;
  OwnFd out2;
  OwnFd out1;
  int pipeFds [2];
  CapabilityPipe capPipe;
  AsyncIoContext io;
  char buffer_1 [4];
  AsyncCapabilityStream local_130;
  undefined8 local_120;
  undefined1 local_118 [8];
  undefined8 uStack_110;
  char *local_108;
  char *local_100;
  bool local_f8;
  bool local_f0;
  OwnFd local_e8;
  OwnFd local_e4;
  Fault local_e0;
  OwnFd local_d8;
  OwnFd local_d4;
  OwnFd local_d0;
  OwnFd local_cc;
  int local_c8 [2];
  uchar *local_c0 [5];
  long *local_98;
  undefined8 *local_90;
  long *local_88;
  void *local_80;
  undefined4 local_6c;
  char *local_68;
  char *pcStack_60;
  undefined8 local_58;
  char *local_50;
  char *pcStack_48;
  undefined8 local_40;
  OwnFd *local_38;
  undefined8 uStack_30;
  
  setupAsyncIo();
  (**(code **)(*local_88 + 0x10))(local_c0);
  local_c8[0] = 0;
  local_c8[1] = 0;
  do {
    iVar2 = ::pipe(local_c8);
    if (-1 < iVar2) goto LAB_00219d29;
    iVar2 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar2 == -1);
  if (iVar2 != 0) {
    local_130.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream = (_func_int **)0x0;
    local_118 = (undefined1  [8])0x0;
    uStack_110 = 0;
    kj::_::Debug::Fault::init
              ((Fault *)&local_130,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_130);
  }
LAB_00219d29:
  local_e4.fd = local_c8[0];
  local_d0.fd = local_c8[1];
  do {
    iVar2 = ::pipe(local_c8);
    if (-1 < iVar2) goto LAB_00219d5e;
    iVar2 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar2 == -1);
  if (iVar2 != 0) {
    local_130.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream = (_func_int **)0x0;
    local_118 = (undefined1  [8])0x0;
    uStack_110 = 0;
    kj::_::Debug::Fault::init
              ((Fault *)&local_130,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_130);
  }
LAB_00219d5e:
  local_e8.fd = local_c8[0];
  local_d4.fd = local_c8[1];
  do {
    iVar2 = ::pipe(local_c8);
    if (-1 < iVar2) goto LAB_00219d93;
    iVar2 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar2 == -1);
  if (iVar2 != 0) {
    local_130.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream = (_func_int **)0x0;
    local_118 = (undefined1  [8])0x0;
    uStack_110 = 0;
    kj::_::Debug::Fault::init
              ((Fault *)&local_130,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_130);
  }
LAB_00219d93:
  local_118._0_4_ = local_d0.fd;
  local_d8.fd = local_c8[0];
  local_38 = (OwnFd *)local_118;
  local_d0.fd = -1;
  local_118._4_4_ = local_d4.fd;
  local_d4.fd = -1;
  uStack_110 = CONCAT44(uStack_110._4_4_,local_c8[1]);
  local_cc.fd = -1;
  uStack_30 = 3;
  fds.size_ = 3;
  fds.ptr = local_38;
  data.size_ = (size_t)&kj::_::ByteLiteral<4ul>;
  data.ptr = local_c0[1];
  AsyncCapabilityStream::writeWithFds
            (&local_130,data,(ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>)ZEXT816(3),fds);
  local_50 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
  ;
  pcStack_48 = "run";
  local_40 = 0x500000348;
  Promise<void>::wait((Promise<void> *)&local_130,local_80);
  node._vptr_AsyncInputStream =
       local_130.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream;
  if ((PromiseArenaMember *)
      local_130.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream !=
      (PromiseArenaMember *)0x0) {
    local_130.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream = (_func_int **)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node._vptr_AsyncInputStream);
  }
  lVar5 = 8;
  do {
    OwnFd::~OwnFd((OwnFd *)(local_118 + lVar5));
    lVar5 = lVar5 + -4;
  } while (lVar5 != -4);
  local_6c = 0;
  local_120 = -1;
  sVar4 = 3;
  (**(code **)(*(long *)local_c0[3] + 0x78))(local_118);
  local_68 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
  ;
  pcStack_60 = "run";
  local_58 = 0x130000034e;
  _Var3 = Promise<kj::AsyncCapabilityStream::ReadResult>::wait
                    ((Promise<kj::AsyncCapabilityStream::ReadResult> *)local_118,local_80);
  node_00 = local_118;
  local_130.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream =
       (_func_int **)CONCAT44(extraout_var,_Var3);
  local_130.super_AsyncIoStream.super_AsyncOutputStream._vptr_AsyncOutputStream = extraout_RDX;
  if (local_118 != (undefined1  [8])0x0) {
    local_118 = (undefined1  [8])0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node_00);
  }
  local_118 = (undefined1  [8])&local_130.super_AsyncIoStream.super_AsyncOutputStream;
  uStack_110 = CONCAT44(uStack_110._4_4_,2);
  local_108 = " == ";
  local_100 = &DAT_00000005;
  local_f8 = local_130.super_AsyncIoStream.super_AsyncOutputStream._vptr_AsyncOutputStream ==
             (_func_int **)0x2;
  if (!local_f8) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,int>&>
              (&local_e0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x34f,FAILED,"result.capCount == 2","_kjCondition,",
               (DebugComparison<unsigned_long_&,_int> *)local_118);
    kj::_::Debug::Fault::fatal(&local_e0);
  }
  local_118 = (undefined1  [8])&PTR__FdOutputStream_006262b0;
  uStack_110 = CONCAT44(0xffffffff,(int)local_120);
  FdOutputStream::write((FdOutputStream *)local_118,0x4b2180,(void *)0x3,sVar4);
  FdOutputStream::~FdOutputStream((FdOutputStream *)local_118);
  local_118 = (undefined1  [8])&PTR__FdOutputStream_006262b0;
  uStack_110 = CONCAT44(0xffffffff,local_120._4_4_);
  FdOutputStream::write((FdOutputStream *)local_118,0x4b2188,(void *)0x3,sVar4);
  FdOutputStream::~FdOutputStream((FdOutputStream *)local_118);
  this_00 = (OwnFd *)((long)&local_120 + 4);
  lVar5 = 0;
  do {
    OwnFd::~OwnFd(this_00);
    lVar5 = lVar5 + 4;
    this_00 = this_00 + -1;
  } while (lVar5 != 8);
  do {
    iVar2 = fcntl(local_e4.fd,4,0x800);
    if (-1 < iVar2) goto LAB_0021a051;
    iVar2 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar2 == -1);
  if (iVar2 != 0) {
    local_130.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream = (_func_int **)0x0;
    local_118 = (undefined1  [8])0x0;
    uStack_110 = 0;
    kj::_::Debug::Fault::init
              ((Fault *)&local_130,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_130);
  }
LAB_0021a051:
  do {
    iVar2 = fcntl(local_e8.fd,4,0x800);
    if (-1 < iVar2) goto LAB_0021a07e;
    iVar2 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar2 == -1);
  if (iVar2 != 0) {
    local_130.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream = (_func_int **)0x0;
    local_118 = (undefined1  [8])0x0;
    uStack_110 = 0;
    kj::_::Debug::Fault::init
              ((Fault *)&local_130,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_130);
  }
LAB_0021a07e:
  do {
    iVar2 = fcntl(local_d8.fd,4,0x800);
    if (-1 < iVar2) goto LAB_0021a0ab;
    iVar2 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar2 == -1);
  if (iVar2 != 0) {
    local_130.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream = (_func_int **)0x0;
    local_118 = (undefined1  [8])0x0;
    uStack_110 = 0;
    kj::_::Debug::Fault::init
              ((Fault *)&local_130,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_130);
  }
LAB_0021a0ab:
  local_e0.exception._0_4_ = 0;
  do {
    local_120 = read(local_e4.fd,&local_e0,4);
    if (-1 < local_120) goto LAB_0021a0ee;
    iVar2 = kj::_::Debug::getOsErrorNumber(true);
  } while (iVar2 == -1);
  if (iVar2 != 0) {
    local_130.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream = (_func_int **)0x0;
    local_118 = (undefined1  [8])0x0;
    uStack_110 = 0;
    kj::_::Debug::Fault::init
              ((Fault *)&local_130,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_130);
  }
LAB_0021a0ee:
  uStack_110 = CONCAT44(uStack_110._4_4_,3);
  local_108 = " == ";
  local_100 = &DAT_00000005;
  local_f8 = local_120 == 3;
  local_118 = (undefined1  [8])&local_120;
  if (!local_f8) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<long&,int>&>
              ((Fault *)&local_130,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x35f,FAILED,"n == 3","_kjCondition,",(DebugComparison<long_&,_int> *)local_118);
    kj::_::Debug::Fault::fatal((Fault *)&local_130);
  }
  local_e0.exception._0_4_ = (uint)local_e0.exception & 0xffffff;
  sVar4 = strlen((char *)&local_e0);
  local_130.super_AsyncIoStream.super_AsyncOutputStream._vptr_AsyncOutputStream =
       (_func_int **)(sVar4 + 1);
  local_130.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream =
       (_func_int **)&local_e0;
  kj::_::DebugExpression<kj::StringPtr>::operator==
            ((DebugComparison<kj::StringPtr,_const_char_(&)[4]> *)local_118,
             (DebugExpression<kj::StringPtr> *)&local_130,(char (*) [4])0x4b858f);
  if (local_f0 == false) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::StringPtr,char_const(&)[4]>&>
              ((Fault *)&local_130,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x361,FAILED,"kj::StringPtr(buffer) == \"bar\"","_kjCondition,",
               (DebugComparison<kj::StringPtr,_const_char_(&)[4]> *)local_118);
    kj::_::Debug::Fault::fatal((Fault *)&local_130);
  }
  do {
    local_120 = read(local_e4.fd,&local_e0,4);
    if (-1 < local_120) goto LAB_0021a198;
    iVar2 = kj::_::Debug::getOsErrorNumber(true);
  } while (iVar2 == -1);
  if (iVar2 != 0) {
    local_130.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream = (_func_int **)0x0;
    local_118 = (undefined1  [8])0x0;
    uStack_110 = 0;
    kj::_::Debug::Fault::init
              ((Fault *)&local_130,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_130);
  }
  if (local_120 < 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[20]>
              ((Fault *)local_118,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x366,FAILED,(char *)0x0,"\"out1 was not closed\"",
               (char (*) [20])"out1 was not closed");
    kj::_::Debug::Fault::fatal((Fault *)local_118);
  }
LAB_0021a198:
  uStack_110 = uStack_110 & 0xffffffff00000000;
  local_108 = " == ";
  local_100 = &DAT_00000005;
  local_f8 = local_120 == 0;
  if (!local_f8) {
    local_118 = (undefined1  [8])&local_120;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<long&,int>&>
              ((Fault *)&local_130,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x368,FAILED,"n == 0","_kjCondition,",(DebugComparison<long_&,_int> *)local_118);
    kj::_::Debug::Fault::fatal((Fault *)&local_130);
  }
  local_118 = (undefined1  [8])&local_120;
  do {
    local_120 = read(local_e8.fd,&local_e0,4);
    if (-1 < local_120) goto LAB_0021a1fd;
    iVar2 = kj::_::Debug::getOsErrorNumber(true);
  } while (iVar2 == -1);
  if (iVar2 != 0) {
    local_130.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream = (_func_int **)0x0;
    local_118 = (undefined1  [8])0x0;
    uStack_110 = 0;
    kj::_::Debug::Fault::init
              ((Fault *)&local_130,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_130);
  }
LAB_0021a1fd:
  uStack_110 = CONCAT44(uStack_110._4_4_,3);
  local_108 = " == ";
  local_100 = &DAT_00000005;
  local_f8 = local_120 == 3;
  if (!local_f8) {
    local_118 = (undefined1  [8])&local_120;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<long&,int>&>
              ((Fault *)&local_130,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x36c,FAILED,"n == 3","_kjCondition,",(DebugComparison<long_&,_int> *)local_118);
    kj::_::Debug::Fault::fatal((Fault *)&local_130);
  }
  local_e0.exception._0_4_ = (uint)local_e0.exception & 0xffffff;
  local_118 = (undefined1  [8])&local_120;
  sVar4 = strlen((char *)&local_e0);
  local_130.super_AsyncIoStream.super_AsyncOutputStream._vptr_AsyncOutputStream =
       (_func_int **)(sVar4 + 1);
  local_130.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream =
       (_func_int **)&local_e0;
  kj::_::DebugExpression<kj::StringPtr>::operator==
            ((DebugComparison<kj::StringPtr,_const_char_(&)[4]> *)local_118,
             (DebugExpression<kj::StringPtr> *)&local_130,(char (*) [4])0x4aa378);
  if (local_f0 == false) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::StringPtr,char_const(&)[4]>&>
              ((Fault *)&local_130,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x36e,FAILED,"kj::StringPtr(buffer) == \"baz\"","_kjCondition,",
               (DebugComparison<kj::StringPtr,_const_char_(&)[4]> *)local_118);
    kj::_::Debug::Fault::fatal((Fault *)&local_130);
  }
  do {
    local_120 = read(local_e8.fd,&local_e0,4);
    if (-1 < local_120) goto LAB_0021a2a7;
    iVar2 = kj::_::Debug::getOsErrorNumber(true);
  } while (iVar2 == -1);
  if (iVar2 != 0) {
    local_130.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream = (_func_int **)0x0;
    local_118 = (undefined1  [8])0x0;
    uStack_110 = 0;
    kj::_::Debug::Fault::init
              ((Fault *)&local_130,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_130);
  }
  if (local_120 < 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[20]>
              ((Fault *)local_118,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x373,FAILED,(char *)0x0,"\"out2 was not closed\"",
               (char (*) [20])"out2 was not closed");
    kj::_::Debug::Fault::fatal((Fault *)local_118);
  }
LAB_0021a2a7:
  uStack_110 = uStack_110 & 0xffffffff00000000;
  local_108 = " == ";
  local_100 = &DAT_00000005;
  local_f8 = local_120 == 0;
  if (!local_f8) {
    local_118 = (undefined1  [8])&local_120;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<long&,int>&>
              ((Fault *)&local_130,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x375,FAILED,"n == 0","_kjCondition,",(DebugComparison<long_&,_int> *)local_118);
    kj::_::Debug::Fault::fatal((Fault *)&local_130);
  }
  local_118 = (undefined1  [8])&local_120;
  do {
    local_120 = read(local_d8.fd,&local_e0,4);
    if (-1 < local_120) goto LAB_0021a315;
    iVar2 = kj::_::Debug::getOsErrorNumber(true);
  } while (iVar2 == -1);
  if (iVar2 != 0) {
    local_130.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream = (_func_int **)0x0;
    local_118 = (undefined1  [8])0x0;
    uStack_110 = 0;
    kj::_::Debug::Fault::init
              ((Fault *)&local_130,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_130);
  }
  if (local_120 < 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[422]>
              ((Fault *)local_118,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x37e,FAILED,(char *)0x0,
               "\"out3 was not closed. This could indicate that your operating system kernel is \" \"buggy and leaks file descriptors when an SCM_RIGHTS message is truncated. FreeBSD was \" \"known to do this until late 2018, while MacOS still has this bug as of this writing in \" \"2019. However, KJ works around the problem on those platforms. You need to enable the \" \"same work-around for your OS -- search for \'SCM_RIGHTS\' in src/kj/async-io-unix.c++.\""
               ,(char (*) [422])
                "out3 was not closed. This could indicate that your operating system kernel is buggy and leaks file descriptors when an SCM_RIGHTS message is truncated. FreeBSD was known to do this until late 2018, while MacOS still has this bug as of this writing in 2019. However, KJ works around the problem on those platforms. You need to enable the same work-around for your OS -- search for \'SCM_RIGHTS\' in src/kj/async-io-unix.c++."
              );
    kj::_::Debug::Fault::fatal((Fault *)local_118);
  }
LAB_0021a315:
  uStack_110 = uStack_110 & 0xffffffff00000000;
  local_108 = " == ";
  local_100 = &DAT_00000005;
  local_f8 = local_120 == 0;
  if (!local_f8) {
    local_118 = (undefined1  [8])&local_120;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<long&,int>&>
              ((Fault *)&local_130,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x380,FAILED,"n == 0","_kjCondition,",(DebugComparison<long_&,_int> *)local_118);
    kj::_::Debug::Fault::fatal((Fault *)&local_130);
  }
  local_118 = (undefined1  [8])&local_120;
  OwnFd::~OwnFd(&local_cc);
  OwnFd::~OwnFd(&local_d8);
  OwnFd::~OwnFd(&local_d4);
  OwnFd::~OwnFd(&local_e8);
  OwnFd::~OwnFd(&local_d0);
  OwnFd::~OwnFd(&local_e4);
  lVar5 = 0x10;
  do {
    plVar1 = *(long **)((long)local_c0 + lVar5 + 8);
    if (plVar1 != (long *)0x0) {
      *(undefined8 *)((long)local_c0 + lVar5 + 8) = 0;
      (**(code **)**(undefined8 **)((long)local_c0 + lVar5))
                (*(undefined8 **)((long)local_c0 + lVar5),(long)plVar1 + *(long *)(*plVar1 + -0x10))
      ;
    }
    plVar1 = local_88;
    lVar5 = lVar5 + -0x10;
  } while (lVar5 != -0x10);
  if (local_88 != (long *)0x0) {
    local_88 = (long *)0x0;
    (**(code **)*local_90)(local_90,(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  plVar1 = local_98;
  if (local_98 != (long *)0x0) {
    local_98 = (long *)0x0;
    (*(code *)**(undefined8 **)local_c0[4])(local_c0[4],(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  return;
}

Assistant:

TEST(AsyncIo, ScmRightsTruncatedEven) {
  // Test that if we send three FDs over a unix socket, but the receiving end only receives two, we
  // don't leak the third FD. This is different from the send-two-receive-one case in that
  // CMSG_SPACE() on many systems rounds up such that there is always space for an even number of
  // FDs. In that case the other test only verifies that our userspace code to close unwanted FDs
  // is correct, whereas *this* test really verifies that the *kernel* properly closes truncated
  // FDs.

  auto io = setupAsyncIo();

  auto capPipe = io.provider->newCapabilityPipe();

  int pipeFds[2]{};
  KJ_SYSCALL(miniposix::pipe(pipeFds));
  kj::OwnFd in1(pipeFds[0]);
  kj::OwnFd out1(pipeFds[1]);

  KJ_SYSCALL(miniposix::pipe(pipeFds));
  kj::OwnFd in2(pipeFds[0]);
  kj::OwnFd out2(pipeFds[1]);

  KJ_SYSCALL(miniposix::pipe(pipeFds));
  kj::OwnFd in3(pipeFds[0]);
  kj::OwnFd out3(pipeFds[1]);

  {
    OwnFd sendFds[3] = { kj::mv(out1), kj::mv(out2), kj::mv(out3) };
    capPipe.ends[0]->writeWithFds("foo"_kjb, nullptr, sendFds).wait(io.waitScope);
  }

  {
    char buffer[4]{};
    OwnFd fdBuffer[2];
    auto result = capPipe.ends[1]->tryReadWithFds(buffer, 3, 3, fdBuffer, 2).wait(io.waitScope);
    KJ_ASSERT(result.capCount == 2);
    kj::FdOutputStream(fdBuffer[0].get()).write("bar"_kjb);
    kj::FdOutputStream(fdBuffer[1].get()).write("baz"_kjb);
  }

  // We want to carefully verify that out1, out2, and out3 were closed, without deadlocking if they
  // weren't. So we manually set nonblocking mode and then issue read()s.
  KJ_SYSCALL(fcntl(in1, F_SETFL, O_NONBLOCK));
  KJ_SYSCALL(fcntl(in2, F_SETFL, O_NONBLOCK));
  KJ_SYSCALL(fcntl(in3, F_SETFL, O_NONBLOCK));

  char buffer[4]{};
  ssize_t n;

  // First we read "bar" from in1.
  KJ_NONBLOCKING_SYSCALL(n = read(in1, buffer, 4));
  KJ_ASSERT(n == 3);
  buffer[3] = '\0';
  KJ_ASSERT(kj::StringPtr(buffer) == "bar");

  // Now it should be EOF.
  KJ_NONBLOCKING_SYSCALL(n = read(in1, buffer, 4));
  if (n < 0) {
    KJ_FAIL_ASSERT("out1 was not closed");
  }
  KJ_ASSERT(n == 0);

  // Next we read "baz" from in2.
  KJ_NONBLOCKING_SYSCALL(n = read(in2, buffer, 4));
  KJ_ASSERT(n == 3);
  buffer[3] = '\0';
  KJ_ASSERT(kj::StringPtr(buffer) == "baz");

  // Now it should be EOF.
  KJ_NONBLOCKING_SYSCALL(n = read(in2, buffer, 4));
  if (n < 0) {
    KJ_FAIL_ASSERT("out2 was not closed");
  }
  KJ_ASSERT(n == 0);

  // Third pipe should have been closed implicitly because we didn't provide space to receive it.
  KJ_NONBLOCKING_SYSCALL(n = read(in3, buffer, 4));
  if (n < 0) {
    KJ_FAIL_ASSERT("out3 was not closed. This could indicate that your operating system kernel is "
        "buggy and leaks file descriptors when an SCM_RIGHTS message is truncated. FreeBSD was "
        "known to do this until late 2018, while MacOS still has this bug as of this writing in "
        "2019. However, KJ works around the problem on those platforms. You need to enable the "
        "same work-around for your OS -- search for 'SCM_RIGHTS' in src/kj/async-io-unix.c++.");
  }
  KJ_ASSERT(n == 0);
}